

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

bool __thiscall spvtools::opt::Instruction::IsReadOnlyPointer(Instruction *this)

{
  bool bVar1;
  IRContext *this_00;
  FeatureManager *this_01;
  Instruction *this_local;
  
  this_00 = context(this);
  this_01 = IRContext::get_feature_mgr(this_00);
  bVar1 = FeatureManager::HasCapability(this_01,Shader);
  if (bVar1) {
    this_local._7_1_ = IsReadOnlyPointerShaders(this);
  }
  else {
    this_local._7_1_ = IsReadOnlyPointerKernel(this);
  }
  return this_local._7_1_;
}

Assistant:

bool Instruction::IsReadOnlyPointer() const {
  if (context()->get_feature_mgr()->HasCapability(spv::Capability::Shader))
    return IsReadOnlyPointerShaders();
  else
    return IsReadOnlyPointerKernel();
}